

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Designator_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Designator_PDU::Designator_PDU(Designator_PDU *this)

{
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Designator_PDU_00221468;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_DesignatingEntityID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_DesignatedEntityID);
  DATA_TYPE::Vector::Vector(&this->m_SpotRegardsToEntity);
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_SpotLocation);
  this->m_ui16Padding1 = 0;
  this->m_ui8Padding2 = '\0';
  DATA_TYPE::Vector::Vector(&this->m_EntityLinearAcceleration);
  (this->super_Header).super_Header6.m_ui8PDUType = '\x18';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x06';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x58;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x05';
  return;
}

Assistant:

Designator_PDU::Designator_PDU() :
    m_ui16Padding1( 0 ),
    m_ui8Padding2( 0 )
{
    m_ui8ProtocolFamily = Distributed_Emission_Regeneration;
    m_ui8PDUType = Designator_PDU_Type;
    m_ui16PDULength = DESIGNATOR_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1_1995;
}